

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O0

__pid_t __thiscall boost::condition_variable::wait(condition_variable *this,void *__stat_loc)

{
  int iVar1;
  __pid_t extraout_EAX;
  pthread_mutex_t *the_mutex;
  interruption_checker check_for_interruption;
  lock_on_exit<boost::unique_lock<boost::mutex>_> guard;
  int res;
  unique_lock<boost::mutex> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  pthread_cond_t *in_stack_ffffffffffffff80;
  pthread_mutex_t *in_stack_ffffffffffffff88;
  interruption_checker *in_stack_ffffffffffffff90;
  condition_error *in_stack_ffffffffffffffd0;
  lock_on_exit<boost::unique_lock<boost::mutex>_> local_20;
  int local_14;
  void *local_10;
  condition_variable *local_8;
  
  local_14 = 0;
  local_10 = __stat_loc;
  local_8 = this;
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::lock_on_exit(&local_20);
  detail::interruption_checker::interruption_checker
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::activate
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  iVar1 = pthread_cond_wait((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this);
  local_14 = iVar1;
  detail::interruption_checker::unlock_if_locked
            ((interruption_checker *)CONCAT44(iVar1,in_stack_ffffffffffffff60));
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::deactivate
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff60));
  detail::interruption_checker::~interruption_checker((interruption_checker *)0x2a569e);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::~lock_on_exit
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff60));
  this_thread::interruption_point();
  if ((local_14 != 0) && (local_14 != 4)) {
    condition_error::condition_error
              ((condition_error *)&in_stack_ffffffffffffff80->__data,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70);
    throw_exception<boost::condition_error>(in_stack_ffffffffffffffd0);
  }
  return extraout_EAX;
}

Assistant:

inline void condition_variable::wait(unique_lock<mutex>& m)
    {
#if defined BOOST_THREAD_THROW_IF_PRECONDITION_NOT_SATISFIED
        if(! m.owns_lock())
        {
            boost::throw_exception(condition_error(-1, "boost::condition_variable::wait() failed precondition mutex not owned"));
        }
#endif
        int res=0;
        {
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            thread_cv_detail::lock_on_exit<unique_lock<mutex> > guard;
            detail::interruption_checker check_for_interruption(&internal_mutex,&cond);
            pthread_mutex_t* the_mutex = &internal_mutex;
            guard.activate(m);
            res = pthread_cond_wait(&cond,the_mutex);
            check_for_interruption.unlock_if_locked();
            guard.deactivate();
#else
            pthread_mutex_t* the_mutex = m.mutex()->native_handle();
            res = pthread_cond_wait(&cond,the_mutex);
#endif
        }
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
        this_thread::interruption_point();
#endif
        if(res && res != EINTR)
        {
            boost::throw_exception(condition_error(res, "boost::condition_variable::wait failed in pthread_cond_wait"));
        }
    }